

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O0

void ex_min(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  t_float tVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  t_float *ptVar5;
  ex_ex *peVar6;
  double local_78;
  int local_58;
  int j;
  t_float scalar;
  t_float *rp;
  t_float *lp;
  t_float *op;
  ex_ex *right;
  ex_ex *left;
  ex_ex *optr_local;
  ex_ex *argv_local;
  long argc_local;
  t_expr *e_local;
  
  peVar6 = argv + 1;
  switch(argv->ex_type) {
  case 1:
    switch(argv[1].ex_type) {
    case 1:
      if (optr->ex_type == 0xf) {
        if ((double)(argv->ex_cont).v_int <= (double)(peVar6->ex_cont).v_int) {
          lVar3 = (argv->ex_cont).v_int;
        }
        else {
          lVar3 = (peVar6->ex_cont).v_int;
        }
        local_58 = e->exp_vsize;
        lp = (optr->ex_cont).v_vec;
        while (local_58 != 0) {
          *lp = (float)lVar3;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 1;
        if ((double)(argv->ex_cont).v_int <= (double)(peVar6->ex_cont).v_int) {
          lVar3 = (argv->ex_cont).v_int;
        }
        else {
          lVar3 = (peVar6->ex_cont).v_int;
        }
        local_78 = (double)lVar3;
        optr->ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)(long)(int)local_78;
      }
      break;
    case 2:
      if (optr->ex_type == 0xf) {
        if ((float)(argv->ex_cont).v_int <= (peVar6->ex_cont).v_flt) {
          fVar2 = (float)(argv->ex_cont).v_int;
        }
        else {
          fVar2 = (peVar6->ex_cont).v_flt;
        }
        local_58 = e->exp_vsize;
        lp = (optr->ex_cont).v_vec;
        while (local_58 != 0) {
          *lp = fVar2;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        if ((float)(argv->ex_cont).v_int <= (peVar6->ex_cont).v_flt) {
          fVar2 = (float)(argv->ex_cont).v_int;
        }
        else {
          fVar2 = (peVar6->ex_cont).v_flt;
        }
        (optr->ex_cont).v_flt = fVar2;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x205,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) {
          post("expr~: Int. error %d",0x205);
          abort();
        }
        optr->ex_type = 0xf;
        ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar5;
      }
      lVar3 = (argv->ex_cont).v_int;
      _j = (peVar6->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      lp = (optr->ex_cont).v_vec;
      while (local_58 != 0) {
        fVar2 = (float)lVar3;
        if (*_j < (float)lVar3) {
          fVar2 = *_j;
        }
        *lp = fVar2;
        _j = _j + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
    break;
  case 2:
    switch(argv[1].ex_type) {
    case 1:
      if (optr->ex_type == 0xf) {
        if ((argv->ex_cont).v_flt <= (float)(peVar6->ex_cont).v_int) {
          fVar2 = (argv->ex_cont).v_flt;
        }
        else {
          fVar2 = (float)(peVar6->ex_cont).v_int;
        }
        local_58 = e->exp_vsize;
        lp = (optr->ex_cont).v_vec;
        while (local_58 != 0) {
          *lp = fVar2;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        if ((argv->ex_cont).v_flt <= (float)(peVar6->ex_cont).v_int) {
          fVar2 = (argv->ex_cont).v_flt;
        }
        else {
          fVar2 = (float)(peVar6->ex_cont).v_int;
        }
        (optr->ex_cont).v_flt = fVar2;
      }
      break;
    case 2:
      if (optr->ex_type == 0xf) {
        if ((argv->ex_cont).v_flt <= (peVar6->ex_cont).v_flt) {
          tVar1 = (argv->ex_cont).v_flt;
        }
        else {
          tVar1 = (peVar6->ex_cont).v_flt;
        }
        local_58 = e->exp_vsize;
        lp = (optr->ex_cont).v_vec;
        while (local_58 != 0) {
          *lp = tVar1;
          local_58 = local_58 + -1;
          lp = lp + 1;
        }
      }
      else {
        optr->ex_type = 2;
        if ((argv->ex_cont).v_flt <= (peVar6->ex_cont).v_flt) {
          tVar1 = (argv->ex_cont).v_flt;
        }
        else {
          tVar1 = (peVar6->ex_cont).v_flt;
        }
        (optr->ex_cont).v_flt = tVar1;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x205,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) {
          post("expr~: Int. error %d",0x205);
          abort();
        }
        optr->ex_type = 0xf;
        ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar5;
      }
      fVar2 = (argv->ex_cont).v_flt;
      _j = (peVar6->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      lp = (optr->ex_cont).v_vec;
      while (local_58 != 0) {
        fVar4 = fVar2;
        if (*_j < fVar2) {
          fVar4 = *_j;
        }
        *lp = fVar4;
        _j = _j + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
    break;
  case 7:
  default:
    pd_error(e,"expr: FUNC_EVAL(%d): bad left type %ld\n",0x205,argv->ex_type);
    break;
  case 0xe:
  case 0xf:
    if (optr->ex_type != 0xf) {
      if (optr->ex_type == 0xe) {
        post("expr~: Int. error %d",0x205);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar5 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar5;
    }
    lp = (optr->ex_cont).v_vec;
    rp = (argv->ex_cont).v_vec;
    switch(argv[1].ex_type) {
    case 1:
      lVar3 = (peVar6->ex_cont).v_int;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        fVar2 = (float)lVar3;
        if (*rp <= (float)lVar3) {
          fVar2 = *rp;
        }
        *lp = fVar2;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
      break;
    case 2:
      fVar2 = (peVar6->ex_cont).v_flt;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        fVar4 = fVar2;
        if (*rp <= fVar2) {
          fVar4 = *rp;
        }
        *lp = fVar4;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
      break;
    case 7:
    default:
      pd_error(e,"expr: FUNC_EVAL(%d): bad right type %ld\n",0x205,argv[1].ex_type);
      break;
    case 0xe:
    case 0xf:
      _j = (peVar6->ex_cont).v_vec;
      local_58 = e->exp_vsize;
      while (local_58 != 0) {
        if (*rp <= *_j) {
          fVar2 = *rp;
        }
        else {
          fVar2 = *_j;
        }
        *lp = fVar2;
        _j = _j + 1;
        rp = rp + 1;
        local_58 = local_58 + -1;
        lp = lp + 1;
      }
    }
  }
  return;
}

Assistant:

static void
ex_min(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;

        FUNC_EVAL(left, right, min, (double), (double), optr, 0);
}